

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O1

int coda_cursor_has_ascii_content(coda_cursor *cursor,int *has_ascii_content)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  coda_type *pcVar4;
  bool bVar5;
  undefined8 uVar6;
  char *message;
  coda_cursor sub_cursor;
  coda_cursor cStack_328;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (pcVar4 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar4 == (coda_type *)0x0)) {
    message = "invalid cursor argument (%s:%u)";
    uVar6 = 0x5c0;
  }
  else {
    if (has_ascii_content != (int *)0x0) {
      if (pcVar4->format == coda_backend_ascii) {
        *has_ascii_content = 1;
      }
      else {
        if (99 < pcVar4->format) {
          pcVar4 = *(coda_type **)&pcVar4->type_class;
        }
        iVar1 = pcVar4->type_class;
        if (iVar1 == 6) {
          memcpy(&cStack_328,cursor,0x310);
          iVar2 = coda_cursor_use_base_type_of_special_type(&cStack_328);
          uVar3 = 0xffffffff;
          if (iVar2 == 0) {
            uVar3 = coda_cursor_has_ascii_content(&cStack_328,has_ascii_content);
          }
        }
        else {
          bVar5 = iVar1 == 4 || pcVar4->format == coda_backend_ascii;
          uVar3 = (uint)bVar5;
          *has_ascii_content = (uint)bVar5;
        }
        if (iVar1 == 6) {
          return uVar3;
        }
      }
      return 0;
    }
    message = "has_ascii_content argument is NULL (%s:%u)";
    uVar6 = 0x5c5;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                 ,uVar6);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_has_ascii_content(const coda_cursor *cursor, int *has_ascii_content)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (has_ascii_content == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "has_ascii_content argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            *has_ascii_content = 1;
            break;
        default:
            {
                coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);

                if (type->type_class == coda_special_class)
                {
                    coda_cursor sub_cursor = *cursor;

                    if (coda_cursor_use_base_type_of_special_type(&sub_cursor) != 0)
                    {
                        return -1;
                    }
                    return coda_cursor_has_ascii_content(&sub_cursor, has_ascii_content);
                }
                *has_ascii_content = (type->format == coda_format_ascii || type->type_class == coda_text_class);
            }
            break;
    }
    return 0;
}